

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

SRC_ERROR sinc_quad_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  SINC_FILTER *filter;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  SRC_ERROR SVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int half_filter_chan_len;
  int iVar18;
  int channels;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double local_78 [4];
  double local_58 [5];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar11 = SRC_ERR_NO_PRIVATE;
  }
  else {
    channels = state->channels;
    lVar20 = (long)channels;
    filter->in_count = data->input_frames * lVar20;
    lVar16 = data->output_frames * lVar20;
    filter->out_count = lVar16;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar28 = state->last_ratio;
    SVar11 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar28) && (dVar28 <= 256.0)) {
      dVar27 = dVar28;
      if (data->src_ratio <= dVar28) {
        dVar27 = data->src_ratio;
      }
      dVar30 = state->last_position;
      dVar32 = dVar30 - (double)(int)ROUND(dVar30);
      dVar32 = (double)(~-(ulong)(dVar32 < 0.0) & (ulong)dVar32 |
                       (ulong)(dVar32 + 1.0) & -(ulong)(dVar32 < 0.0));
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar32;
      iVar21 = filter->b_len;
      lVar17 = (long)((int)ROUND(dVar30 - dVar32) * channels + filter->b_current) % (long)iVar21;
      filter->b_current = (int)lVar17;
      if (lVar16 < 1) {
        lVar17 = 0;
        lVar16 = 0;
      }
      else {
        dVar30 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
        half_filter_chan_len =
             ((int)ROUND((double)(-(ulong)(dVar27 < 1.0) & (ulong)(dVar30 / dVar27) |
                                 ~-(ulong)(dVar27 < 1.0) & (ulong)dVar30)) + 1) * channels;
        dVar27 = 1.0 / dVar28;
        iVar22 = filter->b_end;
        do {
          iVar23 = (int)lVar17;
          dVar32 = auVar33._0_8_;
          if (((iVar22 - iVar23) + iVar21) % iVar21 <= half_filter_chan_len) {
            SVar11 = prepare_data(filter,channels,data,half_filter_chan_len);
            state->error = SVar11;
            if (SVar11 != SRC_ERR_NO_ERROR) {
              return SVar11;
            }
            iVar23 = filter->b_current;
            iVar22 = filter->b_end;
            iVar21 = filter->b_len;
            if (((iVar22 - iVar23) + iVar21) % iVar21 <= half_filter_chan_len) break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end <= (double)iVar23 + dVar32 + dVar27 + 1e-20)) break;
          lVar16 = filter->out_count;
          if (lVar16 < 1) {
            lVar20 = filter->out_gen;
          }
          else {
            dVar30 = state->last_ratio;
            lVar20 = filter->out_gen;
            if (1e-10 < ABS(dVar30 - data->src_ratio)) {
              dVar28 = ((data->src_ratio - dVar30) * (double)lVar20) / (double)lVar16 + dVar30;
            }
          }
          iVar13 = filter->index_inc;
          dVar30 = dVar28;
          if (1.0 <= dVar28) {
            dVar30 = 1.0;
          }
          dVar30 = dVar30 * (double)iVar13;
          uVar25 = (uint)ROUND(dVar30 * 4096.0);
          iVar18 = (int)ROUND(dVar32 * dVar30 * 4096.0);
          pfVar4 = data->data_out;
          channels = state->channels;
          iVar3 = filter->coeff_half_len;
          iVar12 = (iVar3 * 0x1000 - iVar18) / (int)uVar25;
          uVar26 = iVar12 * uVar25 + iVar18;
          uVar15 = iVar23 - iVar12 * channels;
          if ((int)uVar15 < 0) {
            if (((int)uVar25 < 1) || ((int)uVar26 < 0)) {
              __assert_fail("divident >= 0 && divisor > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0xa0,"int int_div_ceil(int, int)");
            }
            uVar24 = 3 - uVar15 >> 2;
            if (((uVar25 + uVar26) - 1) / uVar25 < uVar24) {
              __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x2b8,
                            "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            uVar26 = uVar26 - uVar24 * uVar25;
            uVar15 = uVar15 + (3 - uVar15 & 0xfffffffc);
          }
          local_58[2] = 0.0;
          local_58[3] = 0.0;
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          if (-1 < (int)uVar26) {
            uVar14 = (ulong)uVar15;
            lVar17 = uVar14 * 4;
            do {
              uVar24 = uVar26 >> 0xc;
              if (iVar3 < (int)uVar24) {
                __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x2c0,
                              "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (((int)uVar15 < 0) || (iVar12 = (int)uVar14 + 3, iVar21 <= iVar12)) {
                __assert_fail("data_index >= 0 && data_index + 3 < filter->b_len",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x2c2,
                              "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (iVar22 <= iVar12) {
                __assert_fail("data_index + 3 < filter->b_end",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x2c3,
                              "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              fVar1 = filter->coeffs[uVar24];
              dVar31 = (double)(uVar26 & 0xfff) * 0.000244140625 *
                       (double)(filter->coeffs[(ulong)uVar24 + 1] - fVar1) + (double)fVar1;
              pfVar5 = filter->buffer;
              lVar19 = 0;
              do {
                uVar2 = *(undefined8 *)((long)pfVar5 + lVar19 * 4 + lVar17);
                dVar10 = (double)(float)((ulong)uVar2 >> 0x20) * dVar31 + local_58[lVar19 + 1];
                auVar9._8_4_ = SUB84(dVar10,0);
                auVar9._0_8_ = (double)(float)uVar2 * dVar31 + local_58[lVar19];
                auVar9._12_4_ = (int)((ulong)dVar10 >> 0x20);
                *(undefined1 (*) [16])(local_58 + lVar19) = auVar9;
                lVar19 = lVar19 + 2;
              } while (lVar19 != 4);
              uVar14 = uVar14 + 4;
              lVar17 = lVar17 + 0x10;
              uVar26 = uVar26 - uVar25;
            } while (-1 < (int)uVar26);
          }
          dVar30 = dVar30 / (double)iVar13;
          iVar13 = (int)(iVar3 * 0x1000 - (uVar25 - iVar18)) / (int)uVar25;
          uVar26 = (iVar13 + 1) * channels + iVar23;
          local_78[2] = 0.0;
          local_78[3] = 0.0;
          local_78[0] = 0.0;
          local_78[1] = 0.0;
          uVar15 = iVar13 * uVar25 + (uVar25 - iVar18);
          do {
            uVar24 = (int)uVar15 >> 0xc;
            if (((int)uVar24 < 0) || (iVar3 < (int)uVar24)) {
              __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x2d5,
                            "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            if (((int)uVar26 < 0) || (iVar21 <= (int)(uVar26 + 3))) {
              __assert_fail("data_index >= 0 && data_index + 3 < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x2d7,
                            "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            if (iVar22 <= (int)(uVar26 + 3)) {
              __assert_fail("data_index + 3 < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x2d8,
                            "void calc_output_quad(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            fVar1 = filter->coeffs[uVar24];
            dVar31 = (double)(uVar15 & 0xfff) * 0.000244140625 *
                     (double)(filter->coeffs[(ulong)uVar24 + 1] - fVar1) + (double)fVar1;
            pfVar5 = filter->buffer;
            lVar17 = 0;
            do {
              dVar10 = (double)(float)((ulong)*(undefined8 *)(pfVar5 + (ulong)uVar26 + lVar17) >>
                                      0x20) * dVar31 + local_78[lVar17 + 1];
              auVar7._8_4_ = SUB84(dVar10,0);
              auVar7._0_8_ = (double)(float)*(undefined8 *)(pfVar5 + (ulong)uVar26 + lVar17) *
                             dVar31 + local_78[lVar17];
              auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
              *(undefined1 (*) [16])(local_78 + lVar17) = auVar7;
              lVar17 = lVar17 + 2;
            } while (lVar17 != 4);
            uVar26 = uVar26 - 4;
            uVar24 = uVar15 - uVar25;
            bVar6 = (int)uVar25 <= (int)uVar15;
            uVar15 = uVar24;
          } while (uVar24 != 0 && bVar6);
          lVar17 = 0;
          do {
            *(ulong *)(pfVar4 + lVar20 + lVar17) =
                 CONCAT44((float)((local_58[lVar17 + 1] + local_78[lVar17 + 1]) * dVar30),
                          (float)((local_58[lVar17] + local_78[lVar17]) * dVar30));
            lVar17 = lVar17 + 2;
          } while (lVar17 != 4);
          dVar31 = dVar32 + 1.0 / dVar28;
          filter->out_gen = lVar20 + 4;
          dVar30 = dVar31 - (double)(int)ROUND(dVar31);
          auVar29._0_8_ = ~-(ulong)(dVar30 < 0.0) & (ulong)dVar30;
          auVar29._8_8_ = 0;
          auVar8._8_4_ = auVar33._8_4_;
          auVar8._0_8_ = (ulong)(dVar30 + 1.0) & -(ulong)(dVar30 < 0.0);
          auVar8._12_4_ = auVar33._12_4_;
          auVar33 = auVar29 | auVar8;
          dVar32 = auVar33._0_8_;
          lVar17 = (long)((int)ROUND(dVar31 - dVar32) * channels + iVar23) % (long)iVar21;
          filter->b_current = (int)lVar17;
        } while (lVar20 + 4 < lVar16);
        lVar16 = filter->in_used;
        lVar17 = filter->out_gen;
        lVar20 = (long)state->channels;
      }
      SVar11 = SRC_ERR_NO_ERROR;
      state->last_position = dVar32;
      state->last_ratio = dVar28;
      data->input_frames_used = lVar16 / lVar20;
      data->output_frames_gen = lVar17 / lVar20;
    }
  }
  return SVar11;
}

Assistant:

SRC_ERROR
sinc_quad_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_quad (filter, state->channels, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 4 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}